

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse4.c
# Opt level: O2

uint aom_highbd_10_variance4x4_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t local_sse;
  uint64_t local_28;
  long local_20;
  
  variance4x4_64_sse4_1(a,a_stride,b,b_stride,&local_28,&local_20);
  uVar2 = local_28 + 8 >> 4;
  *sse = (uint32_t)uVar2;
  lVar3 = local_20 + 2 >> 2;
  lVar3 = (uVar2 & 0xffffffff) - ((ulong)(lVar3 * lVar3) >> 4);
  uVar1 = (uint)lVar3;
  if (lVar3 < 0) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t aom_highbd_10_variance4x4_sse4_1(const uint8_t *a, int a_stride,
                                          const uint8_t *b, int b_stride,
                                          uint32_t *sse) {
  int64_t sum, diff;
  uint64_t local_sse;

  variance4x4_64_sse4_1(a, a_stride, b, b_stride, &local_sse, &sum);
  *sse = (uint32_t)ROUND_POWER_OF_TWO(local_sse, 4);
  sum = ROUND_POWER_OF_TWO(sum, 2);

  diff = (int64_t)*sse - ((sum * sum) >> 4);
  return (diff >= 0) ? (uint32_t)diff : 0;
}